

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

void lj_snap_replay(jit_State *J,GCtrace *T)

{
  IRIns *ir;
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  undefined4 uVar6;
  SnapShot *pSVar7;
  IRIns *pIVar8;
  bool bVar9;
  bool bVar10;
  ushort uVar11;
  ushort uVar12;
  IRRef1 IVar13;
  TRef TVar14;
  TRef TVar15;
  uint uVar16;
  ulong uVar17;
  ushort uVar18;
  IRIns *pIVar19;
  ulong uVar20;
  IRIns *pIVar21;
  IRIns *irs;
  uint uVar22;
  uint uVar23;
  SnapEntry *map;
  ulong uVar24;
  IRIns *pIVar25;
  ulong local_80;
  IRRef allocref;
  
  pSVar7 = T->snap;
  uVar5 = J->exitno;
  map = T->snapmap + pSVar7[uVar5].mapofs;
  bVar2 = pSVar7[uVar5].nent;
  uVar17 = (ulong)bVar2;
  J->framedepth = 0;
  bVar9 = false;
  local_80 = 0;
  for (uVar20 = 0; uVar17 != uVar20; uVar20 = uVar20 + 1) {
    uVar16 = map[uVar20];
    uVar22 = uVar16 >> 0x18;
    pIVar25 = (IRIns *)((ulong)((uVar16 & 0xffff) * 8) + (long)T->ir);
    if (((local_80 >> ((ulong)uVar16 & 0x3f) & 1) == 0) ||
       (TVar14 = snap_dedup(J,map,(MSize)uVar20,uVar16 & 0xffff), TVar14 == 0)) {
      local_80 = 1L << ((byte)uVar16 & 0x3f) | local_80;
      if ((uVar16 & 0xffff) < 0x8000) {
        TVar14 = snap_replay_const(J,pIVar25);
      }
      else if (((pIVar25->field_0).prev & 0xff80) == 0x80) {
        bVar9 = true;
        TVar14 = uVar22;
      }
      else {
        uVar11 = 0x21;
        if ((pIVar25->field_1).o == 'F') {
          uVar11 = (pIVar25->field_0).op2 & 0x10 | 0x21;
        }
        (J->fold).ins.field_0.ot = (pIVar25->field_1).t.irt & 0x1f | 0x4600;
        *(ushort *)&(J->fold).ins = (ushort)(byte)(uVar16 >> 0x18);
        (J->fold).ins.field_0.op2 = uVar11;
        TVar14 = lj_ir_emit(J);
      }
    }
    J->slot[uVar22] = TVar14 | uVar16 & 0x30000;
    J->framedepth = J->framedepth + (uint)(0xffffff < uVar16 && (uVar16 & 0x30000) != 0);
    if ((uVar16 >> 0x10 & 1) != 0) {
      J->baseslot = uVar22 + 1;
    }
  }
  bVar10 = true;
  if (bVar9) {
    uVar11 = pSVar7[uVar5].ref;
    pIVar25 = T->ir;
    bVar9 = false;
    for (uVar20 = 0; uVar16 = (uint)bVar2, uVar20 != uVar17; uVar20 = uVar20 + 1) {
      uVar22 = map[uVar20];
      uVar23 = uVar22 & 0xffff;
      pIVar19 = T->ir;
      pIVar21 = pIVar19 + uVar23;
      if ((pIVar21->field_1).r == 0xfd) {
        if (J->slot[uVar22 >> 0x18] == uVar22 >> 0x18) {
          bVar3 = lj_ir_mode[(pIVar21->field_1).o];
          if ((bVar3 & 3) == 0) {
            snap_pref(J,T,map,uVar16,local_80,(uint)(pIVar21->field_0).op1);
          }
          if ((bVar3 & 0xc) == 0) {
            snap_pref(J,T,map,uVar16,local_80,(uint)(pIVar21->field_0).op2);
          }
          bVar9 = true;
          if ((pIVar21->field_1).o != 'R') {
            for (pIVar19 = pIVar19 + (ulong)uVar23 + 1; pIVar19 < pIVar25 + uVar11;
                pIVar19 = pIVar19 + 1) {
              if ((pIVar19->field_1).r == 0xfe) {
                if ((ulong)(pIVar19->field_1).s == 0xff) {
                  uVar22 = snap_sunk_store2(T,pIVar21,pIVar19);
                }
                else {
                  uVar22 = (uint)(pIVar19 == pIVar21 + (pIVar19->field_1).s);
                }
                if ((uVar22 != 0) &&
                   (TVar14 = snap_pref(J,T,map,uVar16,local_80,(uint)(pIVar19->field_0).op2),
                   TVar14 == 0)) {
                  snap_pref(J,T,map,uVar16,local_80,(uint)T->ir[(pIVar19->field_0).op2].field_0.op1)
                  ;
                }
              }
            }
            bVar9 = true;
          }
        }
      }
      else if ((0x7fff < uVar23) && (((pIVar21->field_0).prev & 0xff80) == 0x80)) {
        TVar14 = snap_pref(J,T,map,uVar16,local_80,(uint)(pIVar21->field_0).op1);
        J->slot[uVar22 >> 0x18] = TVar14;
      }
    }
    bVar10 = true;
    if (bVar9) {
      for (uVar20 = 0; bVar10 = !bVar9, uVar20 != uVar17; uVar20 = uVar20 + 1) {
        uVar24 = (ulong)(map[uVar20] & 0xffff);
        pIVar19 = T->ir;
        if (*(char *)((long)pIVar19 + uVar24 * 8 + 6) == -3) {
          uVar22 = map[uVar20] >> 0x18;
          if (J->slot[uVar22] == uVar22) {
            pIVar21 = pIVar19 + uVar24;
            uVar18 = (pIVar21->field_0).op1;
            bVar2 = lj_ir_mode[(pIVar21->field_1).o];
            if ((bVar2 & 3) == 0) {
              TVar14 = snap_pref(J,T,map,uVar16,local_80,(uint)uVar18);
              uVar18 = (ushort)TVar14;
            }
            uVar12 = (pIVar21->field_0).op2;
            if ((bVar2 & 0xc) == 0) {
              TVar14 = snap_pref(J,T,map,uVar16,local_80,(uint)uVar12);
              uVar12 = (ushort)TVar14;
            }
            if ((pIVar21->field_1).o != 'R') {
              (J->fold).ins.field_0.ot = (pIVar21->field_0).ot;
              (J->fold).ins.field_0.op1 = uVar18;
              (J->fold).ins.field_0.op2 = uVar12;
              TVar14 = lj_opt_fold(J);
              J->slot[uVar22] = TVar14;
              pIVar19 = pIVar19 + uVar24;
LAB_001410ff:
              irs = pIVar19 + 1;
              if (irs < pIVar25 + uVar11) {
                if (*(char *)((long)pIVar19 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar19 + 0xf) == 0xff) {
                    uVar22 = snap_sunk_store2(T,pIVar21,irs);
                  }
                  else {
                    uVar22 = (uint)(irs == pIVar21 + *(byte *)((long)pIVar19 + 0xf));
                  }
                  if (uVar22 != 0) {
                    pIVar8 = T->ir;
                    uVar24 = (ulong)(irs->field_0).op1;
                    uVar18 = *(ushort *)((long)pIVar8 + uVar24 * 8 + 2);
                    cVar4 = *(char *)((long)pIVar8 + uVar24 * 8 + 5);
                    IVar13 = (IRRef1)TVar14;
                    if (cVar4 == '>') {
LAB_0014121f:
                      (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar8 + uVar24 * 8 + 4);
                      (J->fold).ins.field_0.op1 = IVar13;
                      (J->fold).ins.field_0.op2 = uVar18;
                      TVar15 = lj_opt_fold(J);
                      uVar12 = (ushort)TVar15;
                    }
                    else {
                      ir = pIVar8 + uVar18;
                      if (cVar4 == '9') {
                        TVar15 = snap_replay_const(J,pIVar8 + (ir->field_0).op1);
                        TVar15 = lj_ir_kslot(J,TVar15,(uint)(ir->field_0).op2);
                        uVar18 = (ushort)TVar15;
                      }
                      else {
                        TVar15 = snap_replay_const(J,ir);
                        uVar18 = (ushort)TVar15;
                      }
                      bVar2 = *(byte *)((long)pIVar8 + uVar24 * 8 + 5);
                      if (bVar2 - 0x38 < 2) {
                        uVar6 = *(undefined4 *)
                                 ((long)T->ir + (ulong)pIVar8[uVar24].field_0.op1 * 8 + 2);
                        (J->fold).ins.field_0.op1 = IVar13;
                        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar6;
                        TVar15 = lj_opt_fold(J);
                        IVar13 = (IRRef1)TVar15;
                        goto LAB_0014121f;
                      }
                      if (bVar2 != 0x3b) goto LAB_0014121f;
                      uVar12 = J->chain[0x3b];
                      if (((uint)uVar12 <= (TVar14 & 0xffff)) ||
                         (*(ushort *)((long)(J->cur).ir + (ulong)uVar12 * 8 + 2) != uVar18))
                      goto LAB_0014121f;
                    }
                    TVar15 = snap_pref(J,T,map,uVar16,local_80,(uint)*(ushort *)((long)pIVar19 + 10)
                                      );
                    if (TVar15 == 0) {
                      TVar15 = snap_pref(J,T,map,uVar16,local_80,
                                         (uint)T->ir[*(ushort *)((long)pIVar19 + 10)].field_0.op1);
                      (J->fold).ins.field_0.op1 = (IRRef1)TVar15;
                      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
                      TVar15 = lj_opt_fold(J);
                    }
                    (J->fold).ins.field_0.ot = *(IROpT *)((long)pIVar19 + 0xc);
                    (J->fold).ins.field_0.op1 = uVar12;
                    (J->fold).ins.field_0.op2 = (IRRef1)TVar15;
                    lj_opt_fold(J);
                    pIVar19 = irs;
                    goto LAB_001410ff;
                  }
                }
                pcVar1 = (char *)((long)pIVar19 + 0xd);
                pIVar19 = irs;
                if ((*pcVar1 == 'X') && ((pIVar21->field_1).o == 'Q')) {
                  (J->fold).ins.field_0.ot = 0x5800;
                  (J->fold).ins.field_1.op12 = 0;
                  lj_opt_fold(J);
                }
                goto LAB_001410ff;
              }
              goto LAB_001410a5;
            }
            (J->fold).ins.field_0.ot = (pIVar21->field_0).ot & 0xff9f;
            (J->fold).ins.field_0.op1 = uVar18;
            (J->fold).ins.field_0.op2 = uVar12;
            TVar14 = lj_opt_fold(J);
          }
          else {
            TVar14 = J->slot[J->slot[uVar22]];
          }
          J->slot[uVar22] = TVar14;
        }
LAB_001410a5:
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = (uint)pSVar7[uVar5].nslots - J->baseslot;
  lj_snap_add(J);
  if (!bVar10) {
    (J->fold).ins.field_0.ot = 0xf80;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
    return;
  }
  return;
}

Assistant:

void lj_snap_replay(jit_State *J, GCtrace *T)
{
  SnapShot *snap = &T->snap[J->exitno];
  SnapEntry *map = &T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  BloomFilter seen = 0;
  int pass23 = 0;
  J->framedepth = 0;
  /* Emit IR for slots inherited from parent snapshot. */
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    BCReg s = snap_slot(sn);
    IRRef ref = snap_ref(sn);
    IRIns *ir = &T->ir[ref];
    TRef tr;
    /* The bloom filter avoids O(nent^2) overhead for de-duping slots. */
    if (bloomtest(seen, ref) && (tr = snap_dedup(J, map, n, ref)) != 0)
      goto setslot;
    bloomset(seen, ref);
    if (irref_isk(ref)) {
      /* See special treatment of LJ_FR2 slot 1 in snapshot_slots() above. */
      if (LJ_FR2 && (sn == SNAP(1, SNAP_FRAME | SNAP_NORESTORE, REF_NIL)))
	tr = 0;
      else
	tr = snap_replay_const(J, ir);
    } else if (!regsp_used(ir->prev)) {
      pass23 = 1;
      lj_assertJ(s != 0, "unused slot 0 in snapshot");
      tr = s;
    } else {
      IRType t = irt_type(ir->t);
      uint32_t mode = IRSLOAD_INHERIT|IRSLOAD_PARENT;
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM)) t = IRT_NUM;
      if (ir->o == IR_SLOAD) mode |= (ir->op2 & IRSLOAD_READONLY);
      tr = emitir_raw(IRT(IR_SLOAD, t), s, mode);
    }
  setslot:
    J->slot[s] = tr | (sn&(SNAP_CONT|SNAP_FRAME));  /* Same as TREF_* flags. */
    J->framedepth += ((sn & (SNAP_CONT|SNAP_FRAME)) && (s != LJ_FR2));
    if ((sn & SNAP_FRAME))
      J->baseslot = s+1;
  }
  if (pass23) {
    IRIns *irlast = &T->ir[snap->ref];
    pass23 = 0;
    /* Emit dependent PVALs. */
    for (n = 0; n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	uint8_t m;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) continue;
	pass23 = 1;
	lj_assertJ(ir->o == IR_TNEW || ir->o == IR_TDUP ||
		   ir->o == IR_CNEW || ir->o == IR_CNEWI,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	m = lj_ir_mode[ir->o];
	if (irm_op1(m) == IRMref) snap_pref(J, T, map, nent, seen, ir->op1);
	if (irm_op2(m) == IRMref) snap_pref(J, T, map, nent, seen, ir->op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP)
	    snap_pref(J, T, map, nent, seen, (ir+1)->op2);
	} else {
	  IRIns *irs;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      if (snap_pref(J, T, map, nent, seen, irs->op2) == 0)
		snap_pref(J, T, map, nent, seen, T->ir[irs->op2].op1);
	      else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
		       irs+1 < irlast && (irs+1)->o == IR_HIOP)
		snap_pref(J, T, map, nent, seen, (irs+1)->op2);
	    }
	}
      } else if (!irref_isk(refp) && !regsp_used(ir->prev)) {
	lj_assertJ(ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT,
		   "sunk parent IR %04d has bad op %d", refp - REF_BIAS, ir->o);
	J->slot[snap_slot(sn)] = snap_pref(J, T, map, nent, seen, ir->op1);
      }
    }
    /* Replay sunk instructions. */
    for (n = 0; pass23 && n < nent; n++) {
      SnapEntry sn = map[n];
      IRRef refp = snap_ref(sn);
      IRIns *ir = &T->ir[refp];
      if (regsp_reg(ir->r) == RID_SUNK) {
	TRef op1, op2;
	uint8_t m;
	if (J->slot[snap_slot(sn)] != snap_slot(sn)) {  /* De-dup allocs. */
	  J->slot[snap_slot(sn)] = J->slot[J->slot[snap_slot(sn)]];
	  continue;
	}
	op1 = ir->op1;
	m = lj_ir_mode[ir->o];
	if (irm_op1(m) == IRMref) op1 = snap_pref(J, T, map, nent, seen, op1);
	op2 = ir->op2;
	if (irm_op2(m) == IRMref) op2 = snap_pref(J, T, map, nent, seen, op2);
	if (LJ_HASFFI && ir->o == IR_CNEWI) {
	  if (LJ_32 && refp+1 < T->nins && (ir+1)->o == IR_HIOP) {
	    lj_needsplit(J);  /* Emit joining HIOP. */
	    op2 = emitir_raw(IRT(IR_HIOP, IRT_I64), op2,
			     snap_pref(J, T, map, nent, seen, (ir+1)->op2));
	  }
	  J->slot[snap_slot(sn)] = emitir(ir->ot & ~(IRT_MARK|IRT_ISPHI), op1, op2);
	} else {
	  IRIns *irs;
	  TRef tr = emitir(ir->ot, op1, op2);
	  J->slot[snap_slot(sn)] = tr;
	  for (irs = ir+1; irs < irlast; irs++)
	    if (irs->r == RID_SINK && snap_sunk_store(T, ir, irs)) {
	      IRIns *irr = &T->ir[irs->op1];
	      TRef val, key = irr->op2, tmp = tr;
	      if (irr->o != IR_FREF) {
		IRIns *irk = &T->ir[key];
		if (irr->o == IR_HREFK)
		  key = lj_ir_kslot(J, snap_replay_const(J, &T->ir[irk->op1]),
				    irk->op2);
		else
		  key = snap_replay_const(J, irk);
		if (irr->o == IR_HREFK || irr->o == IR_AREF) {
		  IRIns *irf = &T->ir[irr->op1];
		  tmp = emitir(irf->ot, tmp, irf->op2);
		} else if (irr->o == IR_NEWREF) {
		  IRRef allocref = tref_ref(tr);
		  IRRef keyref = tref_ref(key);
		  IRRef newref_ref = J->chain[IR_NEWREF];
		  IRIns *newref = &J->cur.ir[newref_ref];
		  lj_assertJ(irref_isk(keyref),
			     "sunk store for parent IR %04d with bad key %04d",
			     refp - REF_BIAS, keyref - REF_BIAS);
		  if (newref_ref > allocref && newref->op2 == keyref) {
		    lj_assertJ(newref->op1 == allocref,
			       "sunk store for parent IR %04d with bad tab %04d",
			       refp - REF_BIAS, allocref - REF_BIAS);
		    tmp = newref_ref;
		    goto skip_newref;
		  }
		}
	      }
	      tmp = emitir(irr->ot, tmp, key);
	    skip_newref:
	      val = snap_pref(J, T, map, nent, seen, irs->op2);
	      if (val == 0) {
		IRIns *irc = &T->ir[irs->op2];
		lj_assertJ(irc->o == IR_CONV && irc->op2 == IRCONV_NUM_INT,
			   "sunk store for parent IR %04d with bad op %d",
			   refp - REF_BIAS, irc->o);
		val = snap_pref(J, T, map, nent, seen, irc->op1);
		val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
	      } else if ((LJ_SOFTFP32 || (LJ_32 && LJ_HASFFI)) &&
			 irs+1 < irlast && (irs+1)->o == IR_HIOP) {
		IRType t = IRT_I64;
		if (LJ_SOFTFP32 && irt_type((irs+1)->t) == IRT_SOFTFP)
		  t = IRT_NUM;
		lj_needsplit(J);
		if (irref_isk(irs->op2) && irref_isk((irs+1)->op2)) {
		  uint64_t k = (uint32_t)T->ir[irs->op2].i +
			       ((uint64_t)T->ir[(irs+1)->op2].i << 32);
		  val = lj_ir_k64(J, t == IRT_I64 ? IR_KINT64 : IR_KNUM, k);
		} else {
		  val = emitir_raw(IRT(IR_HIOP, t), val,
			  snap_pref(J, T, map, nent, seen, (irs+1)->op2));
		}
		tmp = emitir(IRT(irs->o, t), tmp, val);
		continue;
	      }
	      tmp = emitir(irs->ot, tmp, val);
	    } else if (LJ_HASFFI && irs->o == IR_XBAR && ir->o == IR_CNEW) {
	      emitir(IRT(IR_XBAR, IRT_NIL), 0, 0);
	    }
	}
      }
    }
  }
  J->base = J->slot + J->baseslot;
  J->maxslot = snap->nslots - J->baseslot;
  lj_snap_add(J);
  if (pass23)  /* Need explicit GC step _after_ initial snapshot. */
    emitir_raw(IRTG(IR_GCSTEP, IRT_NIL), 0, 0);
}